

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tester.h
# Opt level: O0

void __thiscall
psy::Tester::
run<psy::C::SemanticModelTester,std::vector<std::pair<std::function<void(psy::C::SemanticModelTester*)>,char_const*>,std::allocator<std::pair<std::function<void(psy::C::SemanticModelTester*)>,char_const*>>>>
          (Tester *this,
          vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
          *tests)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  TestFailed *anon_var_0;
  function<void_(psy::C::SemanticModelTester_*)> curTestFunc;
  undefined1 local_58 [8];
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> testData;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
  *__range2;
  vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
  *tests_local;
  Tester *this_local;
  
  __end0 = std::
           vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
           ::begin(tests);
  testData.second =
       (char *)std::
               vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
               ::end(tests);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_*,_std::vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>_>
                                *)&testData.second);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_*,_std::vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>_>
             ::operator*(&__end0);
    std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::pair
              ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_58,
               ppVar2);
    (*this->_vptr_Tester[3])();
    std::__cxx11::string::operator=((string *)&this->curTestFunc_,(char *)testData.first._M_invoker)
    ;
    poVar3 = std::operator<<((ostream *)&std::cout,"\t");
    poVar3 = std::operator<<(poVar3,(string *)&C::SemanticModelTester::Name_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"-");
    poVar3 = std::operator<<(poVar3,(string *)&this->curTestFunc_);
    std::operator<<(poVar3,"... ");
    std::function<void_(psy::C::SemanticModelTester_*)>::function
              ((function<void_(psy::C::SemanticModelTester_*)> *)&anon_var_0,
               (function<void_(psy::C::SemanticModelTester_*)> *)local_58);
    std::function<void_(psy::C::SemanticModelTester_*)>::operator()
              ((function<void_(psy::C::SemanticModelTester_*)> *)&anon_var_0,
               (SemanticModelTester *)this);
    std::operator<<((ostream *)&std::cout,"OK");
    this->cntPassed_ = this->cntPassed_ + 1;
    std::function<void_(psy::C::SemanticModelTester_*)>::~function
              ((function<void_(psy::C::SemanticModelTester_*)> *)&anon_var_0);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "\n\t-------------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    (*this->_vptr_Tester[4])();
    std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>::~pair
              ((pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> *)local_58);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_*,_std::vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void run(const TestContT& tests)
    {
        for (auto testData : tests) {
            setUp();

            curTestFunc_ = testData.second;
            std::cout << "\t" << TesterT::Name << "-" << curTestFunc_ << "... ";

            try {
                auto curTestFunc = testData.first;
                curTestFunc(static_cast<TesterT*>(this));
                std::cout << "OK";
                ++cntPassed_;
            } catch (const TestFailed&) {
                ++cntFailed_;
            }
            std::cout << "\n\t-------------------------------------------------" << std::endl;

            tearDown();
        }
    }